

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O2

void lts2::WaveletTransform2D
               (Mat *src,Mat *dest,double *P,double *Q,int fsize,int *ww,int *wh,int stop_after)

{
  uint uVar1;
  reference pvVar2;
  ostream *poVar3;
  uint uVar4;
  int iVar5;
  int k;
  uint uVar6;
  uint n;
  ulong __n;
  uint uVar7;
  uint local_b8;
  vector<cv::Mat,_std::allocator<cv::Mat>_> components;
  uint local_68;
  uint local_64;
  _OutputArray local_60;
  _InputArray local_48;
  
  if (*(long *)(src + 0x10) != 0) {
    local_b8 = **(uint **)(src + 0x40);
    n = (*(uint **)(src + 0x40))[1];
    uVar1 = local_b8;
    if ((int)local_b8 < (int)n) {
      uVar1 = n;
    }
    if (-1 < stop_after) {
      uVar1 = stop_after;
    }
    local_68 = n;
    local_64 = local_b8;
    cv::Mat::create(dest,&local_68,*(uint *)src & 0xfff);
    local_60.super__InputArray.obj = &components;
    components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    local_48.sz.width = 0;
    local_48.sz.height = 0;
    local_48.flags = 0x1010000;
    local_60.super__InputArray.sz.width = 0;
    local_60.super__InputArray.sz.height = 0;
    components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    components.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    local_60.super__InputArray.flags = 0x2050000;
    local_48.obj = src;
    cv::split(&local_48,&local_60);
    for (iVar5 = 0;
        ((((n & 1) == 0 && (fsize <= (int)n)) && (fsize <= (int)local_b8)) &&
        (((local_b8 & 1) == 0 && (iVar5 < (int)uVar1)))); iVar5 = iVar5 + 1) {
      uVar4 = 0;
      if (0 < (int)local_b8) {
        uVar4 = local_b8;
      }
      uVar7 = 0;
      if (0 < (int)n) {
        uVar7 = n;
      }
      for (__n = 0; __n < (ulong)(((long)components.
                                         super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)components.
                                        super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                        _M_impl.super__Vector_impl_data._M_start) / 0x60);
          __n = __n + 1) {
        for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
          pvVar2 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at(&components,__n);
          Wavegeneral_h(pvVar2,uVar6,n,0,P,Q,fsize);
        }
        for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
          pvVar2 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::at(&components,__n);
          Wavegeneral_v(pvVar2,uVar6,local_b8,0,P,Q,fsize);
        }
      }
      *wh = local_b8;
      *ww = n;
      n = (int)n >> 1;
      local_b8 = (int)local_b8 >> 1;
    }
    local_48.sz.width = 0;
    local_48.sz.height = 0;
    local_60.super__InputArray.sz.width = 0;
    local_60.super__InputArray.sz.height = 0;
    local_48.flags = 0x1050000;
    local_48.obj = &components;
    local_60.super__InputArray.flags = 0x2010000;
    local_60.super__InputArray.obj = dest;
    cv::merge(&local_48,&local_60);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&components);
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"gmg_WaveletTransform2D() src == NULL");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void lts2::WaveletTransform2D(const cv::Mat& src, cv::Mat& dest, 
                              double *P, double *Q, int fsize, int *ww, int *wh, int stop_after)
{
  if (!src.data) 
  {
    std::cerr << "gmg_WaveletTransform2D() src == NULL" << std::endl;
    return;
  }
	
  cv::Size imageSize = src.size();
    
  int input_w = imageSize.width;
  int input_h = imageSize.height;
	
  if (stop_after < 0) 
    stop_after = MAX(input_w, input_h);
	
  dest.create(imageSize, src.type());
	
  int width = imageSize.width;//XBDW(src)-XBUP(src);
  int height = imageSize.height;//YBDW(src)-YBUP(src);
	
  std::vector<cv::Mat> components;
  cv::split(src, components);
	
  int loop_count = 0;
  while(width>=fsize && height>=fsize && !(width%2) && !(height%2) && loop_count < stop_after) 
  {
		
    for(int b = 0; b < components.size(); ++b) 
    {
      for(int k = 0; k < height; ++k)
        Wavegeneral_h(components.at(b), k, width, 0, P, Q, fsize);
      for(int k = 0; k < width; ++k)
        Wavegeneral_v(components.at(b), k, height, 0, P, Q, fsize);
    }
        
    *wh = height;
    *ww = width;
		
    width /= 2; 
    height /= 2;
		
    ++loop_count;    
  }
	
  cv::merge(components, dest);
}